

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void readsmallobjects(uint32 numsmallobjects,uint8 **ptr,uint32 *len,MOJOSHADER_effect *effect,
                     char *profile,MOJOSHADER_swizzle *swiz,uint swizcount,
                     MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                     MOJOSHADER_free f,void *d)

{
  int *piVar1;
  MOJOSHADER_effectObject *pMVar2;
  MOJOSHADER_effectParam *pMVar3;
  long lVar4;
  int iVar5;
  MOJOSHADER_parseData *pMVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint32 uVar11;
  long lVar12;
  char *str;
  uint32 uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  char mainfn [32];
  
  if (1 < numsmallobjects + 1) {
    uVar13 = 1;
    do {
      uVar16 = *len;
      uVar10 = 0;
      uVar8 = 0;
      if (3 < uVar16) {
        uVar8 = (ulong)*(uint *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar10 = uVar16 - 4;
      }
      *len = uVar10;
      uVar11 = 0;
      uVar16 = 0;
      if (3 < uVar10) {
        uVar16 = *(uint *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar11 = uVar10 - 4;
      }
      *len = uVar11;
      pMVar2 = effect->objects;
      switch(pMVar2[uVar8].type) {
      case MOJOSHADER_SYMTYPE_STRING:
      case MOJOSHADER_SYMTYPE_SAMPLER:
      case MOJOSHADER_SYMTYPE_SAMPLER1D:
      case MOJOSHADER_SYMTYPE_SAMPLER2D:
      case MOJOSHADER_SYMTYPE_SAMPLER3D:
      case MOJOSHADER_SYMTYPE_SAMPLERCUBE:
        if (uVar16 != 0) {
          pvVar7 = (*m)(uVar16,d);
          memcpy(pvVar7,*ptr,(ulong)uVar16);
          *(void **)((long)pMVar2 + uVar8 * 0x48 + 8) = pvVar7;
        }
        break;
      case MOJOSHADER_SYMTYPE_TEXTURE:
      case MOJOSHADER_SYMTYPE_TEXTURE1D:
      case MOJOSHADER_SYMTYPE_TEXTURE2D:
      case MOJOSHADER_SYMTYPE_TEXTURE3D:
      case MOJOSHADER_SYMTYPE_TEXTURECUBE:
        break;
      case MOJOSHADER_SYMTYPE_PIXELSHADER:
      case MOJOSHADER_SYMTYPE_VERTEXSHADER:
        snprintf(mainfn,0x20,"ShaderFunction%u");
        *(undefined8 *)((long)pMVar2 + uVar8 * 0x48 + 4) = 0xffffffffffffffff;
        pMVar6 = MOJOSHADER_parse(profile,mainfn,*ptr,uVar16,swiz,swizcount,smap,smapcount,m,f,d);
        *(MOJOSHADER_parseData **)((long)pMVar2 + uVar8 * 0x48 + 0x40) = pMVar6;
        iVar5 = pMVar6->symbol_count;
        if (0 < iVar5) {
          lVar9 = 8;
          lVar12 = 0;
          do {
            if (*(int *)((long)&pMVar6->symbols->name + lVar9) == 3) {
              piVar1 = (int *)((long)pMVar2 + uVar8 * 0x48 + 0x30);
              *piVar1 = *piVar1 + 1;
            }
            lVar12 = lVar12 + 1;
            pMVar6 = *(MOJOSHADER_parseData **)((long)pMVar2 + uVar8 * 0x48 + 0x40);
            iVar5 = pMVar6->symbol_count;
            lVar9 = lVar9 + 0x38;
          } while (lVar12 < iVar5);
        }
        *(int *)((long)pMVar2 + uVar8 * 0x48 + 0x20) = iVar5;
        pvVar7 = (*m)(iVar5 << 2,d);
        *(void **)((long)pMVar2 + uVar8 * 0x48 + 0x28) = pvVar7;
        pvVar7 = (*m)(*(int *)((long)pMVar2 + uVar8 * 0x48 + 0x30) * 0x18,d);
        *(void **)((long)pMVar2 + uVar8 * 0x48 + 0x38) = pvVar7;
        lVar9 = *(long *)((long)pMVar2 + uVar8 * 0x48 + 0x40);
        if (0 < *(int *)(lVar9 + 0xa0)) {
          lVar12 = 0;
          lVar14 = 0;
          uVar10 = 0;
          do {
            iVar5 = findparameter(effect->params,effect->param_count,
                                  *(char **)(*(long *)(lVar9 + 0xa8) + lVar12));
            *(int *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x28) + lVar14 * 4) = iVar5;
            lVar9 = *(long *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x40) + 0xa8);
            if (*(int *)(lVar9 + 8 + lVar12) == 3) {
              lVar4 = (ulong)uVar10 * 0x18;
              *(undefined8 *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x38) + lVar4) =
                   *(undefined8 *)(lVar9 + lVar12);
              *(undefined4 *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x38) + 8 + lVar4) =
                   *(undefined4 *)
                    (*(long *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x40) + 0xa8) + 0xc + lVar12)
              ;
              pMVar3 = effect->params;
              *(uint *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x38) + 0xc + lVar4) =
                   pMVar3[iVar5].value.value_count;
              *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
               (*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x38) + 0x10 + lVar4) =
                   pMVar3[iVar5].value.field_4;
              uVar10 = uVar10 + 1;
            }
            lVar14 = lVar14 + 1;
            lVar9 = *(long *)((long)pMVar2 + uVar8 * 0x48 + 0x40);
            lVar12 = lVar12 + 0x38;
          } while (lVar14 < *(int *)(lVar9 + 0xa0));
        }
        if (*(long *)(lVar9 + 0xb0) != 0) {
          iVar5 = *(int *)(*(long *)(lVar9 + 0xb0) + 0x14);
          *(int *)((long)pMVar2 + uVar8 * 0x48 + 0x10) = iVar5;
          pvVar7 = (*m)(iVar5 << 2,d);
          *(void **)((long)pMVar2 + uVar8 * 0x48 + 0x18) = pvVar7;
          lVar9 = *(long *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x40) + 0xb0);
          if (*(int *)(lVar9 + 0x14) != 0) {
            lVar12 = 0;
            uVar15 = 0;
            do {
              iVar5 = findparameter(effect->params,effect->param_count,
                                    *(char **)(*(long *)(lVar9 + 0x18) + lVar12));
              *(int *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x18) + uVar15 * 4) = iVar5;
              uVar15 = uVar15 + 1;
              lVar9 = *(long *)(*(long *)((long)pMVar2 + uVar8 * 0x48 + 0x40) + 0xb0);
              lVar12 = lVar12 + 0x38;
            } while (uVar15 < *(uint *)(lVar9 + 0x14));
          }
        }
        break;
      default:
        __assert_fail("0 && \"Small object type unknown!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x2b1,
                      "void readsmallobjects(const uint32, const uint8 **, uint32 *, MOJOSHADER_effect *, const char *, const MOJOSHADER_swizzle *, const unsigned int, const MOJOSHADER_samplerMap *, const unsigned int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      uVar16 = uVar16 + 3 & 0xfffffffc;
      *ptr = *ptr + uVar16;
      *len = *len - uVar16;
      bVar17 = uVar13 != numsmallobjects;
      uVar13 = uVar13 + 1;
    } while (bVar17);
  }
  return;
}

Assistant:

static void readsmallobjects(const uint32 numsmallobjects,
                             const uint8 **ptr,
                             uint32 *len,
                             MOJOSHADER_effect *effect,
                             const char *profile,
                             const MOJOSHADER_swizzle *swiz,
                             const unsigned int swizcount,
                             const MOJOSHADER_samplerMap *smap,
                             const unsigned int smapcount,
                             MOJOSHADER_malloc m,
                             MOJOSHADER_free f,
                             void *d)
{
    int i, j;
    if (numsmallobjects == 0) return;

    for (i = 1; i < numsmallobjects + 1; i++)
    {
        const uint32 index = readui32(ptr, len);
        const uint32 length = readui32(ptr, len);

        MOJOSHADER_effectObject *object = &effect->objects[index];
        if (object->type == MOJOSHADER_SYMTYPE_STRING)
        {
            if (length > 0)
            {
                char *str = (char *) m(length, d);
                memcpy(str, *ptr, length);
                object->string.string = str;
            } // if
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_TEXTURE
              || object->type == MOJOSHADER_SYMTYPE_TEXTURE1D
              || object->type == MOJOSHADER_SYMTYPE_TEXTURE2D
              || object->type == MOJOSHADER_SYMTYPE_TEXTURE3D
              || object->type == MOJOSHADER_SYMTYPE_TEXTURECUBE)
        {
            // No-op. Why is this even here?
        } // else if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            if (length > 0)
            {
                char *str = (char *) m(length, d);
                memcpy(str, *ptr, length);
                object->mapping.name = str;
            } // if
        } // else if
        else if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
              || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            char mainfn[32];
            snprintf(mainfn, sizeof (mainfn), "ShaderFunction%u", (unsigned int) index);
            object->shader.technique = -1;
            object->shader.pass = -1;
            object->shader.shader = MOJOSHADER_parse(profile, mainfn, *ptr, length,
                                                     swiz, swizcount, smap, smapcount,
                                                     m, f, d);
            // !!! FIXME: check for errors.
            for (j = 0; j < object->shader.shader->symbol_count; j++)
                if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                    object->shader.sampler_count++;
            object->shader.param_count = object->shader.shader->symbol_count;
            object->shader.params = (uint32 *) m(object->shader.param_count * sizeof (uint32), d);
            object->shader.samplers = (MOJOSHADER_samplerStateRegister *) m(object->shader.sampler_count * sizeof (MOJOSHADER_samplerStateRegister), d);
            uint32 curSampler = 0;
            for (j = 0; j < object->shader.shader->symbol_count; j++)
            {
                int par = findparameter(effect->params,
                                        effect->param_count,
                                        object->shader.shader->symbols[j].name);
                object->shader.params[j] = par;
                if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                {
                    object->shader.samplers[curSampler].sampler_name = object->shader.shader->symbols[j].name;
                    object->shader.samplers[curSampler].sampler_register = object->shader.shader->symbols[j].register_index;
                    object->shader.samplers[curSampler].sampler_state_count = effect->params[par].value.value_count;
                    object->shader.samplers[curSampler].sampler_states = effect->params[par].value.valuesSS;
                    curSampler++;
                } // if
            } // for
            if (object->shader.shader->preshader)
            {
                object->shader.preshader_param_count = object->shader.shader->preshader->symbol_count;
                object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                for (j = 0; j < object->shader.shader->preshader->symbol_count; j++)
                {
                    object->shader.preshader_params[j] = findparameter(effect->params,
                                                                       effect->param_count,
                                                                       object->shader.shader->preshader->symbols[j].name);
                } // for
            } // if
        } // else if
        else
        {
            assert(0 && "Small object type unknown!");
        } // else

        /* Object block is always a multiple of four */
        const uint32 blocklen = (length + 3) - ((length - 1) % 4);
        *ptr += blocklen;
        *len -= blocklen;
    } // for
}